

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_mpi.c
# Opt level: O2

int kvtree_sendrecv(kvtree *hash_send,int rank_send,kvtree *hash_recv,int rank_recv,MPI_Comm comm)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *buf;
  char cVar4;
  ulong uVar5;
  char *buf_00;
  int size_send;
  int size_recv;
  char *buf_recv;
  char *buf_send;
  MPI_Request request [2];
  MPI_Status status [2];
  
  if (rank_recv == -2) {
    size_send = 0;
    size_recv = 0;
    uVar5 = 0;
    if (rank_send == -2) {
      buf_send = (char *)0x0;
      buf_recv = (char *)0x0;
      buf_00 = (char *)0x0;
      goto LAB_00106e7b;
    }
LAB_00106d24:
    sVar3 = kvtree_pack_size(hash_send);
    if ((sVar3 & 0xffffffff80000000) != 0) {
      kvtree_abort(-1,"kvtree_sendrecv: hash size %lu is bigger than INT_MAX %d @ %s:%d",sVar3,
                   0x7fffffff,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_mpi.c"
                   ,0x7a);
    }
    size_send = (int)sVar3;
    MPI_Isend(&size_send,1,&ompi_mpi_int,rank_send,0,comm,request + uVar5);
    uVar5 = (ulong)((int)uVar5 + 1);
  }
  else {
    uVar5 = 1;
    kvtree_unset_all(hash_recv);
    size_send = 0;
    size_recv = 0;
    MPI_Irecv(&size_recv,1,&ompi_mpi_int,rank_recv,0,comm,request);
    if (rank_send != -2) goto LAB_00106d24;
  }
  MPI_Waitall(uVar5,request,status);
  iVar2 = size_recv;
  sVar3 = (size_t)size_recv;
  buf_send = (char *)0x0;
  buf_recv = (char *)0x0;
  if ((long)sVar3 < 1) {
    buf_00 = (char *)0x0;
  }
  else {
    buf_00 = (char *)kvtree_malloc(sVar3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_mpi.c"
                                   ,0x8d);
    buf_recv = buf_00;
    MPI_Irecv(buf_00,size_recv,&ompi_mpi_byte,rank_recv,0,comm,request);
  }
  bVar1 = (long)sVar3 >= 1;
  if (size_send < 1) {
    if (iVar2 < 1) goto LAB_00106e7b;
    cVar4 = '\x01';
  }
  else {
    buf = (char *)kvtree_malloc((ulong)(uint)size_send,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_mpi.c"
                                ,0x93);
    buf_send = buf;
    kvtree_pack(buf,hash_send);
    MPI_Isend(buf,size_send,&ompi_mpi_byte,rank_send,0,comm,request + bVar1);
    cVar4 = bVar1 + '\x01';
  }
  MPI_Waitall(cVar4,request,status);
LAB_00106e7b:
  if (0 < size_recv) {
    kvtree_unpack(buf_00,hash_recv);
  }
  kvtree_free(&buf_recv);
  kvtree_free(&buf_send);
  return 0;
}

Assistant:

int kvtree_sendrecv(const kvtree* hash_send, int rank_send,
                            kvtree* hash_recv, int rank_recv,
                            MPI_Comm comm)
{
  int rc = KVTREE_SUCCESS;

  int num_req;
  MPI_Request request[2];
  MPI_Status  status[2];

  /* determine whether we have a rank to send to and a rank to receive from */
  int have_outgoing = 0;
  int have_incoming = 0;
  if (rank_send != MPI_PROC_NULL) {
    have_outgoing = 1;
  }
  if (rank_recv != MPI_PROC_NULL) {
    kvtree_unset_all(hash_recv);
    have_incoming = 1;
  }

  /* exchange hash pack sizes in order to allocate buffers */
  num_req = 0;
  int size_send = 0;
  int size_recv = 0;
  if (have_incoming) {
    MPI_Irecv(&size_recv, 1, MPI_INT, rank_recv, 0, comm, &request[num_req]);
    num_req++;
  }
  if (have_outgoing) {
    /* get size of packed hash and check that it doesn't exceed INT_MAX */
    size_t pack_size = kvtree_pack_size(hash_send);
    size_t max_int = (size_t) INT_MAX;
    if (pack_size > max_int) {
      kvtree_abort(-1, "kvtree_sendrecv: hash size %lu is bigger than INT_MAX %d @ %s:%d",
        (unsigned long) pack_size, INT_MAX, __FILE__, __LINE__
      );
    }

    /* tell rank how big the pack size is */
    size_send = (int) pack_size;
    MPI_Isend(&size_send, 1, MPI_INT, rank_send, 0, comm, &request[num_req]);
    num_req++;
  }
  if (num_req > 0) {
    MPI_Waitall(num_req, request, status);
  }

  /* allocate space to pack our hash and space to receive the incoming hash */
  num_req = 0;
  char* buf_send = NULL;
  char* buf_recv = NULL;
  if (size_recv > 0) {
    /* allocate space to receive a packed hash, and receive it */
    buf_recv = (char*) KVTREE_MALLOC((size_t)size_recv);
    MPI_Irecv(buf_recv, size_recv, MPI_BYTE, rank_recv, 0, comm, &request[num_req]);
    num_req++;
  }
  if (size_send > 0) {
    /* allocate space, pack our hash, and send it */
    buf_send = (char*) KVTREE_MALLOC((size_t)size_send);
    kvtree_pack(buf_send, hash_send);
    MPI_Isend(buf_send, size_send, MPI_BYTE, rank_send, 0, comm, &request[num_req]);
    num_req++;
  }
  if (num_req > 0) {
    MPI_Waitall(num_req, request, status);
  }

  /* unpack the hash into the hash_recv provided by the caller */
  if (size_recv > 0) {
    kvtree_unpack(buf_recv, hash_recv);
  }

  /* free the pack buffers */
  kvtree_free(&buf_recv);
  kvtree_free(&buf_send);

  return rc;
}